

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetGlyphKernAdvance(stbtt_fontinfo *info,int g1,int g2)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uchar *puVar4;
  long lVar5;
  uint uVar6;
  stbtt_uint32 sVar7;
  ushort *puVar8;
  byte *pbVar9;
  ushort uVar10;
  long lVar11;
  ulong uVar12;
  ushort uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  byte *pbVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  
  lVar11 = (long)info->gpos;
  uVar22 = 0;
  if (((lVar11 != 0) &&
      (puVar4 = info->data,
      (ushort)(*(ushort *)(puVar4 + lVar11) << 8 | *(ushort *)(puVar4 + lVar11) >> 8) == 1)) &&
     (puVar4[lVar11 + 3] == '\0' && puVar4[lVar11 + 2] == '\0')) {
    uVar18 = (ulong)(ushort)(*(ushort *)(puVar4 + lVar11 + 8) << 8 |
                            *(ushort *)(puVar4 + lVar11 + 8) >> 8);
    uVar1 = *(ushort *)(puVar4 + uVar18 + lVar11);
    lVar11 = uVar18 + lVar11;
    for (uVar18 = 0; uVar22 = 0, uVar18 != (ushort)(uVar1 << 8 | uVar1 >> 8); uVar18 = uVar18 + 1) {
      uVar20 = (ulong)(ushort)(*(ushort *)(puVar4 + uVar18 * 2 + lVar11 + 2) << 8 |
                              *(ushort *)(puVar4 + uVar18 * 2 + lVar11 + 2) >> 8);
      if ((ushort)(*(ushort *)(puVar4 + uVar20 + lVar11) << 8 |
                  *(ushort *)(puVar4 + uVar20 + lVar11) >> 8) == 2) {
        lVar26 = uVar20 + lVar11;
        uVar2 = *(ushort *)(puVar4 + lVar26 + 4);
        uVar20 = 0;
LAB_00139d2b:
        uVar22 = 0;
        if (uVar20 != (ushort)(uVar2 << 8 | uVar2 >> 8)) {
          uVar12 = (ulong)(ushort)(*(ushort *)(puVar4 + uVar20 * 2 + lVar26 + 6) << 8 |
                                  *(ushort *)(puVar4 + uVar20 * 2 + lVar26 + 6) >> 8);
          lVar24 = uVar12 + lVar26;
          uVar17 = (ulong)(ushort)(*(ushort *)(puVar4 + uVar12 + lVar26 + 2) << 8 |
                                  *(ushort *)(puVar4 + uVar12 + lVar26 + 2) >> 8);
          lVar5 = uVar17 + lVar24;
          uVar13 = *(ushort *)(puVar4 + uVar17 + lVar24) << 8 |
                   *(ushort *)(puVar4 + uVar17 + lVar24) >> 8;
          if (uVar13 == 2) {
            iVar16 = 0;
            uVar15 = (uint)(ushort)(*(ushort *)(puVar4 + lVar5 + 2) << 8 |
                                   *(ushort *)(puVar4 + lVar5 + 2) >> 8);
            do {
              uVar6 = uVar15;
              while( true ) {
                if ((int)uVar6 <= iVar16) goto LAB_00139f96;
                uVar15 = (int)(iVar16 + (uVar6 - 1)) >> 1;
                lVar25 = (long)(int)uVar15 * 6;
                uVar23 = (uint)(ushort)(*(ushort *)(puVar4 + lVar25 + lVar5 + 4) << 8 |
                                       *(ushort *)(puVar4 + lVar25 + lVar5 + 4) >> 8);
                if (g1 < (int)uVar23) break;
                if ((uint)g1 <=
                    (uint)(ushort)(*(ushort *)(puVar4 + lVar25 + lVar5 + 6) << 8 |
                                  *(ushort *)(puVar4 + lVar25 + lVar5 + 6) >> 8)) {
                  uVar15 = (g1 - uVar23) +
                           (uint)(ushort)(*(ushort *)(puVar4 + lVar25 + lVar5 + 8) << 8 |
                                         *(ushort *)(puVar4 + lVar25 + lVar5 + 8) >> 8);
                  goto LAB_00139e2b;
                }
                iVar16 = uVar15 + 1;
              }
            } while( true );
          }
          if (uVar13 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                          ,0x92f,"stbtt_int32 stbtt__GetCoverageIndex(stbtt_uint8 *, int)");
          }
          iVar16 = 0;
          uVar15 = (uint)(ushort)(*(ushort *)(puVar4 + lVar5 + 2) << 8 |
                                 *(ushort *)(puVar4 + lVar5 + 2) >> 8);
          do {
            uVar6 = uVar15;
            while( true ) {
              if ((int)uVar6 <= iVar16) goto LAB_00139f96;
              iVar14 = iVar16 + (uVar6 - 1);
              uVar15 = iVar14 >> 1;
              uVar23 = (uint)(ushort)(*(ushort *)
                                       (puVar4 + ((long)iVar14 & 0xfffffffffffffffeU) + lVar5 + 4)
                                      << 8 | *(ushort *)
                                              (puVar4 + ((long)iVar14 & 0xfffffffffffffffeU) +
                                                        lVar5 + 4) >> 8);
              if (g1 < (int)uVar23) break;
              if ((uint)g1 <= uVar23) goto LAB_00139e2b;
              iVar16 = uVar15 + 1;
            }
          } while( true );
        }
      }
    }
  }
LAB_00139fd2:
  lVar11 = (long)info->kern;
  if (lVar11 != 0) {
    puVar4 = info->data;
    uVar15 = 0;
    if ((puVar4[lVar11 + 3] != '\0' || puVar4[lVar11 + 2] != '\0') &&
       (uVar15 = 0,
       (ushort)(*(ushort *)(puVar4 + lVar11 + 8) << 8 | *(ushort *)(puVar4 + lVar11 + 8) >> 8) == 1)
       ) {
      iVar16 = (ushort)(*(ushort *)(puVar4 + lVar11 + 10) << 8 |
                       *(ushort *)(puVar4 + lVar11 + 10) >> 8) - 1;
      uVar15 = g1 << 0x10 | g2;
      iVar14 = 0;
      while (iVar14 <= iVar16) {
        iVar19 = iVar16 + iVar14 >> 1;
        lVar26 = (long)iVar19 * 6;
        sVar7 = ttULONG(puVar4 + lVar26 + lVar11 + 0x12);
        if (uVar15 < sVar7) {
          iVar16 = iVar19 + -1;
        }
        else {
          if (uVar15 <= sVar7) {
            uVar15 = (int)(short)((ushort)puVar4[lVar26 + lVar11 + 0x16] << 8) |
                     (uint)puVar4[lVar26 + lVar11 + 0x17];
            goto LAB_0013a05c;
          }
          iVar14 = iVar19 + 1;
        }
      }
      uVar15 = 0;
    }
LAB_0013a05c:
    uVar22 = uVar15 + uVar22;
  }
  return uVar22;
LAB_00139e2b:
  if (uVar15 != 0xffffffff) {
    uVar13 = *(ushort *)(puVar4 + uVar12 + lVar26) << 8 | *(ushort *)(puVar4 + uVar12 + lVar26) >> 8
    ;
    if (uVar13 != 2) {
      if (uVar13 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                      ,0x9d8,
                      "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                     );
      }
      if (((ushort)(*(ushort *)(puVar4 + lVar24 + 4) << 8 | *(ushort *)(puVar4 + lVar24 + 4) >> 8)
           == 4) &&
         ((*(ushort *)(puVar4 + lVar24 + 6) & 0xff) == 0 &&
          *(ushort *)(puVar4 + lVar24 + 6) >> 8 == 0)) {
        if ((int)(uint)(ushort)(*(ushort *)(puVar4 + lVar24 + 8) << 8 |
                               *(ushort *)(puVar4 + lVar24 + 8) >> 8) <= (int)uVar15) {
          __assert_fail("coverageIndex < pairSetCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                        ,0x9a1,
                        "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)"
                       );
        }
        puVar8 = (ushort *)
                 (puVar4 + (ulong)(ushort)(*(ushort *)(puVar4 + (long)(int)uVar15 * 2 + lVar24 + 10)
                                           << 8 | *(ushort *)
                                                   (puVar4 + (long)(int)uVar15 * 2 + lVar24 + 10) >>
                                                  8) + lVar24);
        iVar16 = 0;
        uVar22 = (uint)(ushort)(*puVar8 << 8 | *puVar8 >> 8);
        do {
          uVar15 = uVar22;
          while( true ) {
            if ((int)uVar15 <= iVar16) goto LAB_00139f96;
            uVar22 = (int)(iVar16 + (uVar15 - 1)) >> 1;
            lVar24 = (long)(int)(uVar22 * 4);
            uVar13 = *(ushort *)((long)puVar8 + lVar24 + 2);
            uVar6 = (uint)(ushort)(uVar13 << 8 | uVar13 >> 8);
            if (g2 < (int)uVar6) break;
            if ((uint)g2 <= uVar6) {
              pbVar9 = (byte *)((long)puVar8 + lVar24 + 4);
              pbVar21 = (byte *)((long)puVar8 + lVar24 + 5);
              goto LAB_00139fbd;
            }
            iVar16 = uVar22 + 1;
          }
        } while( true );
      }
      goto LAB_00139fd2;
    }
    uVar13 = *(ushort *)(puVar4 + lVar24 + 4);
    uVar3 = *(ushort *)(puVar4 + lVar24 + 6);
    uVar10 = *(ushort *)(puVar4 + lVar24 + 10);
    uVar15 = stbtt__GetGlyphClass
                       (puVar4 + (ulong)(ushort)(*(ushort *)(puVar4 + lVar24 + 8) << 8 |
                                                *(ushort *)(puVar4 + lVar24 + 8) >> 8) + lVar24,g1);
    uVar6 = stbtt__GetGlyphClass(puVar4 + (ulong)(ushort)(uVar10 << 8 | uVar10 >> 8) + lVar24,g2);
    if ((int)(uint)(ushort)(*(ushort *)(puVar4 + lVar24 + 0xc) << 8 |
                           *(ushort *)(puVar4 + lVar24 + 0xc) >> 8) <= (int)uVar15) {
      __assert_fail("glyph1class < class1Count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                    ,0x9c5,
                    "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)");
    }
    uVar10 = *(ushort *)(puVar4 + lVar24 + 0xe) << 8 | *(ushort *)(puVar4 + lVar24 + 0xe) >> 8;
    if ((int)(uint)uVar10 <= (int)uVar6) {
      __assert_fail("glyph2class < class2Count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                    ,0x9c6,
                    "stbtt_int32 stbtt__GetGlyphGPOSInfoAdvance(const stbtt_fontinfo *, int, int)");
    }
    if ((ushort)(uVar13 << 8 | uVar13 >> 8) != 4) {
      uVar22 = 0;
      goto LAB_00139fd2;
    }
    uVar22 = 0;
    if ((uVar3 & 0xff) != 0 || uVar3 >> 8 != 0) goto LAB_00139fd2;
    if (-1 < (int)(uVar6 | uVar15)) {
      lVar24 = (ulong)(uVar15 * uVar10 * 2) + lVar24;
      pbVar9 = puVar4 + (ulong)uVar6 * 2 + lVar24 + 0x10;
      pbVar21 = puVar4 + (ulong)uVar6 * 2 + lVar24 + 0x11;
LAB_00139fbd:
      uVar22 = (int)(short)((ushort)*pbVar9 << 8) | (uint)*pbVar21;
      goto LAB_00139fd2;
    }
  }
LAB_00139f96:
  uVar20 = uVar20 + 1;
  goto LAB_00139d2b;
}

Assistant:

STBTT_DEF int  stbtt_GetGlyphKernAdvance(const stbtt_fontinfo *info, int g1, int g2)
{
   int xAdvance = 0;

   if (info->gpos)
      xAdvance += stbtt__GetGlyphGPOSInfoAdvance(info, g1, g2);

   if (info->kern)
      xAdvance += stbtt__GetGlyphKernInfoAdvance(info, g1, g2);

   return xAdvance;
}